

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O2

Result __thiscall
presolve::HPresolve::removeSlacks(HPresolve *this,HighsPostsolveStack *postsolve_stack)

{
  double *pdVar1;
  double rhs;
  double dVar2;
  double dVar3;
  double dVar4;
  uint uVar5;
  int row;
  HighsLp *pHVar6;
  pointer pdVar7;
  pointer pdVar8;
  pointer pdVar9;
  ulong uVar10;
  double dVar11;
  double dVar12;
  iterator __begin3;
  iterator __end3;
  undefined4 local_108;
  uint uStack_104;
  iterator local_f0;
  HighsMatrixSlice<HighsTripletTreeSlicePreOrder> local_b0;
  undefined4 local_88;
  uint uStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  _Vector_base<int,_std::allocator<int>_> local_58;
  int local_40;
  
  uVar10 = 0;
  while( true ) {
    pHVar6 = this->model;
    if (uVar10 == (uint)pHVar6->num_col_) break;
    if ((((this->colDeleted).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start[uVar10] == '\0') &&
        ((this->colsize).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_start[uVar10] == 1)) &&
       ((pHVar6->integrality_).super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
        _M_impl.super__Vector_impl_data._M_start[uVar10] != kInteger)) {
      uVar5 = (this->colhead).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[uVar10];
      row = (this->Arow).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[(int)uVar5];
      pdVar7 = (pHVar6->row_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar8 = (pHVar6->row_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      rhs = pdVar7[row];
      pdVar1 = pdVar8 + row;
      if ((rhs == *pdVar1) && (!NAN(rhs) && !NAN(*pdVar1))) {
        dVar2 = (pHVar6->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[uVar10];
        dVar3 = (pHVar6->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[uVar10];
        pdVar9 = (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        dVar4 = pdVar9[(int)uVar5];
        dVar11 = dVar2;
        if (dVar4 <= 0.0) {
          dVar11 = dVar3;
        }
        dVar12 = (pHVar6->col_cost_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar10];
        pdVar7[row] = rhs - (double)(~-(ulong)(0.0 < dVar4) & (ulong)dVar2 |
                                    (ulong)dVar3 & -(ulong)(0.0 < dVar4)) * dVar4;
        pdVar8[row] = rhs - dVar11 * dVar4;
        if ((dVar12 != 0.0) || (NAN(dVar12))) {
          dVar12 = dVar12 / dVar4;
          local_b0.nodeLeft =
               (this->ARleft).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
          local_b0.nodeRight =
               (this->ARright).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
          local_b0.nodeIndex =
               (this->Acol).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
          local_b0.root =
               (this->rowroot).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[row];
          local_b0.nodeValue = pdVar9;
          HighsMatrixSlice<HighsTripletTreeSlicePreOrder>::begin(&local_f0,&local_b0);
          local_58._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_58._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_68 = 0;
          uStack_60 = 0;
          local_58._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_78 = 0;
          uStack_70 = 0;
          local_40 = -1;
          local_108 = SUB84(dVar12,0);
          uStack_104 = (uint)((ulong)dVar12 >> 0x20);
          uStack_84 = uStack_104 ^ 0x80000000;
          uStack_7c = 0x80000000;
          local_88 = local_108;
          uStack_80 = 0;
          while (local_f0.currentNode != local_40) {
            pdVar7 = (this->model->col_cost_).super__Vector_base<double,_std::allocator<double>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            pdVar7[*local_f0.pos_.index_] =
                 *local_f0.pos_.value_ * (double)CONCAT44(uStack_84,local_88) +
                 pdVar7[*local_f0.pos_.index_];
            HighsMatrixSlice<HighsTripletTreeSlicePreOrder>::iterator::operator++(&local_f0);
          }
          std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_58);
          std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                    (&local_f0.stack.super__Vector_base<int,_std::allocator<int>_>);
          this->model->offset_ = dVar12 * rhs + this->model->offset_;
        }
        local_f0.pos_.value_ =
             (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
        local_f0.pos_.index_ =
             (this->Acol).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
        local_f0.nodeLeft =
             (this->ARleft).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
        local_f0.nodeRight =
             (this->ARright).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
        local_f0.stack.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
        ._M_start._0_4_ =
             (this->rowroot).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start[row];
        HighsPostsolveStack::slackColSubstitution<HighsTripletTreeSlicePreOrder>
                  (postsolve_stack,row,(HighsInt)uVar10,rhs,
                   (HighsMatrixSlice<HighsTripletTreeSlicePreOrder> *)&local_f0);
        (this->changedColFlag).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start[uVar10] = '\x01';
        (this->colDeleted).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
        .super__Vector_impl_data._M_start[uVar10] = '\x01';
        this->numDeletedCols = this->numDeletedCols + 1;
        unlink(this,(char *)(ulong)uVar5);
      }
    }
    uVar10 = uVar10 + 1;
  }
  return kOk;
}

Assistant:

HPresolve::Result HPresolve::removeSlacks(
    HighsPostsolveStack& postsolve_stack) {
  // SingletonColumns data structure appears not to be retained
  // throughout presolve
  for (HighsInt iCol = 0; iCol != model->num_col_; ++iCol) {
    if (colDeleted[iCol]) continue;
    if (colsize[iCol] != 1) continue;
    if (model->integrality_[iCol] == HighsVarType::kInteger) continue;
    HighsInt coliter = colhead[iCol];
    HighsInt iRow = Arow[coliter];
    assert(Acol[coliter] == iCol);
    assert(!rowDeleted[iRow]);
    if (model->row_lower_[iRow] != model->row_upper_[iRow]) continue;
    double lower = model->col_lower_[iCol];
    double upper = model->col_upper_[iCol];
    double cost = model->col_cost_[iCol];
    double rhs = model->row_lower_[iRow];
    double coeff = Avalue[coliter];
    assert(coeff);
    // Slack is s = (rhs - a^Tx)/coeff
    //
    // Constraint bounds become:
    //
    // For coeff > 0 [rhs - coeff * upper, rhs - coeff * lower]
    //
    // For coeff < 0 [rhs - coeff * lower, rhs - coeff * upper]
    model->row_lower_[iRow] =
        coeff > 0 ? rhs - coeff * upper : rhs - coeff * lower;
    model->row_upper_[iRow] =
        coeff > 0 ? rhs - coeff * lower : rhs - coeff * upper;
    if (cost) {
      // Cost is (cost * rhs / coeff) + (col_cost - (cost/coeff) row_values)^Tx
      double multiplier = cost / coeff;
      for (const HighsSliceNonzero& nonzero : getRowVector(iRow)) {
        HighsInt local_iCol = nonzero.index();
        double local_value = nonzero.value();
        model->col_cost_[local_iCol] -= multiplier * local_value;
      }
      model->offset_ += multiplier * rhs;
    }
    //
    postsolve_stack.slackColSubstitution(iRow, iCol, rhs, getRowVector(iRow));

    markColDeleted(iCol);

    unlink(coliter);
  }
  return Result::kOk;
}